

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Functional::ShaderSourceReplaceCase::readSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderSourceReplaceCase *this,Shader *shader)

{
  GLint GVar1;
  vector<char,_std::allocator<char>_> sourceBuffer;
  allocator_type local_39;
  _Vector_base<char,_std::allocator<char>_> local_38;
  
  GVar1 = getSourceLength(this,shader);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_38,(long)(GVar1 + 1),&local_39);
  glu::CallLogWrapper::glGetShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,shader->m_shader,
             (int)local_38._M_impl.super__Vector_impl_data._M_finish -
             (int)local_38._M_impl.super__Vector_impl_data._M_start,(GLsizei *)0x0,
             local_38._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_38._M_impl.super__Vector_impl_data._M_start,
             &local_39);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string readSource (glu::Shader& shader)
	{
		const GLint			sourceLength	= getSourceLength(shader);
		std::vector<char>	sourceBuffer	(sourceLength + 1);

		glGetShaderSource(shader.getShader(), (GLsizei)sourceBuffer.size(), 0, &sourceBuffer[0]);

		return std::string(&sourceBuffer[0]);
	}